

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_orderby.cpp
# Opt level: O2

bool __thiscall
duckdb::Transformer::TransformOrderBy
          (Transformer *this,PGList *order,vector<duckdb::OrderByNode,_true> *result)

{
  PGNodeTag PVar1;
  PGNodeTag PVar2;
  PGNode *pPVar3;
  NotImplementedException *pNVar4;
  PGList *pPVar5;
  OrderType type;
  OrderByNullType null_order;
  allocator local_61;
  optional_ptr<duckdb_libpgquery::PGNode,_true> temp_node;
  _Alloc_hider local_50;
  
  if (order != (PGList *)0x0) {
    pPVar5 = order;
    while (pPVar5 = (PGList *)pPVar5->head, pPVar5 != (PGList *)0x0) {
      temp_node.ptr = *(PGNode **)pPVar5;
      pPVar3 = optional_ptr<duckdb_libpgquery::PGNode,_true>::operator->(&temp_node);
      if (pPVar3->type != T_PGSortBy) {
        pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffb0,"ORDER BY list member type %d\n",
                   (allocator *)&type);
        pPVar3 = optional_ptr<duckdb_libpgquery::PGNode,_true>::operator->(&temp_node);
        NotImplementedException::NotImplementedException<duckdb_libpgquery::PGNodeTag>
                  (pNVar4,(string *)&stack0xffffffffffffffb0,pPVar3->type);
        __cxa_throw(pNVar4,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      PVar1 = temp_node.ptr[4].type;
      PVar2 = temp_node.ptr[5].type;
      if (PVar1 == T_PGExprContext) {
        type = DESCENDING;
      }
      else if (PVar1 == T_PGIndexInfo) {
        type = ASCENDING;
      }
      else {
        if (PVar1 != T_PGInvalid) {
          pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffffb0,"Unimplemented order by type",&local_61);
          NotImplementedException::NotImplementedException
                    (pNVar4,(string *)&stack0xffffffffffffffb0);
          __cxa_throw(pNVar4,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        type = ORDER_DEFAULT;
      }
      if (PVar2 == T_PGExprContext) {
        null_order = NULLS_LAST;
      }
      else if (PVar2 == T_PGIndexInfo) {
        null_order = NULLS_FIRST;
      }
      else {
        if (PVar2 != T_PGInvalid) {
          pNVar4 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffffb0,"Unimplemented order by type",&local_61);
          NotImplementedException::NotImplementedException
                    (pNVar4,(string *)&stack0xffffffffffffffb0);
          __cxa_throw(pNVar4,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error
                     );
        }
        null_order = ORDER_DEFAULT;
      }
      TransformExpression((Transformer *)&stack0xffffffffffffffb0,
                          (optional_ptr<duckdb_libpgquery::PGNode,_true>)this);
      ::std::vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>>::
      emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::OrderByNode,std::allocator<duckdb::OrderByNode>> *)result,&type,
                 &null_order,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&stack0xffffffffffffffb0);
      if ((Transformer *)local_50._M_p != (Transformer *)0x0) {
        (**(code **)(*(long *)local_50._M_p + 8))();
      }
    }
  }
  return order != (PGList *)0x0;
}

Assistant:

bool Transformer::TransformOrderBy(duckdb_libpgquery::PGList *order, vector<OrderByNode> &result) {
	if (!order) {
		return false;
	}

	for (auto node = order->head; node != nullptr; node = node->next) {
		auto temp_node = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
		if (temp_node->type != duckdb_libpgquery::T_PGSortBy) {
			throw NotImplementedException("ORDER BY list member type %d\n", temp_node->type);
		}

		OrderType type;
		OrderByNullType null_order;
		auto sort = PGCast<duckdb_libpgquery::PGSortBy>(*temp_node.get());
		auto target = sort.node;

		if (sort.sortby_dir == duckdb_libpgquery::PG_SORTBY_DEFAULT) {
			type = OrderType::ORDER_DEFAULT;
		} else if (sort.sortby_dir == duckdb_libpgquery::PG_SORTBY_ASC) {
			type = OrderType::ASCENDING;
		} else if (sort.sortby_dir == duckdb_libpgquery::PG_SORTBY_DESC) {
			type = OrderType::DESCENDING;
		} else {
			throw NotImplementedException("Unimplemented order by type");
		}

		if (sort.sortby_nulls == duckdb_libpgquery::PG_SORTBY_NULLS_DEFAULT) {
			null_order = OrderByNullType::ORDER_DEFAULT;
		} else if (sort.sortby_nulls == duckdb_libpgquery::PG_SORTBY_NULLS_FIRST) {
			null_order = OrderByNullType::NULLS_FIRST;
		} else if (sort.sortby_nulls == duckdb_libpgquery::PG_SORTBY_NULLS_LAST) {
			null_order = OrderByNullType::NULLS_LAST;
		} else {
			throw NotImplementedException("Unimplemented order by type");
		}

		auto order_expression = TransformExpression(target);
		result.emplace_back(type, null_order, std::move(order_expression));
	}
	return true;
}